

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hierarchic_fe.h
# Opt level: O0

Matrix<double,_1,__1,_1,_1,__1> __thiscall
lf::fe::FeHierarchicTria<double>::NodalValuesToEdgeDofs
          (FeHierarchicTria<double> *this,Matrix<double,_1,__1,_1,_1,__1> *nodevals)

{
  double dVar1;
  value_type_conflict3 vVar2;
  value_type_conflict3 vVar3;
  int iVar4;
  Index IVar5;
  uint uVar6;
  const_reference pvVar7;
  const_reference ppQVar8;
  DenseBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *pDVar9;
  DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *pDVar10;
  reference peVar11;
  CoeffReturnType pdVar12;
  Scalar *pSVar13;
  DenseBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_> *in_RDX;
  Index extraout_RDX;
  array<unsigned_int,_3UL> *paVar14;
  double dVar15;
  CwiseUnaryOp<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_lib_lf_fe_hierarchic_fe_h:962:15),_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
  CVar16;
  CwiseUnaryOp<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_lib_lf_fe_hierarchic_fe_h:982:15),_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
  CVar17;
  CwiseUnaryOp<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_lib_lf_fe_hierarchic_fe_h:1003:15),_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
  CVar18;
  Matrix<double,_1,__1,_1,_1,__1> MVar19;
  size_type local_444;
  size_type local_440;
  size_type local_43c;
  Type local_420;
  ArrayWrapper<const_Eigen::Block<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1,__1,_false>_>
  local_3e8;
  NestedExpressionType local_3b0;
  non_const_type local_3a8;
  NestedExpressionType local_3a0;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::ArrayWrapper<const_Eigen::Transpose<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>,_const_Eigen::ArrayWrapper<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>_>
  local_398;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::ArrayWrapper<const_Eigen::Transpose<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>,_const_Eigen::ArrayWrapper<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>_>,_const_Eigen::ArrayWrapper<const_Eigen::Block<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1,__1,_false>_>_>
  local_380;
  Scalar local_320;
  double integ3;
  CwiseUnaryOp<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_lib_lf_fe_hierarchic_fe_h:1003:15),_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
  local_310;
  undefined1 local_300 [8];
  Matrix<double,_1,__1,_1,_1,__1> psidd_2;
  double P1_2;
  double P0_2;
  undefined1 local_2d8 [4];
  size_type i_2;
  ArrayWrapper<const_Eigen::Block<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1,__1,_false>_>
  local_2a0;
  NestedExpressionType local_268;
  non_const_type local_260;
  NestedExpressionType local_258;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::ArrayWrapper<const_Eigen::Transpose<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>,_const_Eigen::ArrayWrapper<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>_>
  local_250;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::ArrayWrapper<const_Eigen::Transpose<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>,_const_Eigen::ArrayWrapper<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>_>,_const_Eigen::ArrayWrapper<const_Eigen::Block<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1,__1,_false>_>_>
  local_238;
  Scalar local_1d8;
  double integ2;
  CwiseUnaryOp<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_lib_lf_fe_hierarchic_fe_h:982:15),_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
  local_1c8;
  undefined1 local_1b8 [8];
  Matrix<double,_1,__1,_1,_1,__1> psidd_1;
  double P1_1;
  double P0_1;
  undefined1 local_190 [4];
  size_type i_1;
  ArrayWrapper<const_Eigen::Block<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1,__1,_false>_>
  local_158;
  NestedExpressionType local_120;
  non_const_type local_118;
  NestedExpressionType local_110;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::ArrayWrapper<const_Eigen::Transpose<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>,_const_Eigen::ArrayWrapper<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>_>
  local_108;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::ArrayWrapper<const_Eigen::Transpose<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>,_const_Eigen::ArrayWrapper<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>_>,_const_Eigen::ArrayWrapper<const_Eigen::Block<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1,__1,_false>_>_>
  local_f0;
  Scalar local_90;
  double integ1;
  CwiseUnaryOp<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_lib_lf_fe_hierarchic_fe_h:962:15),_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
  local_80;
  undefined1 local_70 [8];
  Matrix<double,_1,__1,_1,_1,__1> psidd;
  double P1;
  double P0;
  uint local_38;
  size_type i;
  size_type local_30;
  size_type local_2c;
  size_type Nt;
  size_type Ns2;
  size_type Ns1;
  size_type Ns0;
  Matrix<double,_1,__1,_1,_1,__1> *nodevals_local;
  FeHierarchicTria<double> *this_local;
  Matrix<double,_1,__1,_1,_1,__1> *dofs;
  
  _Ns1 = in_RDX;
  nodevals_local = nodevals;
  this_local = this;
  pvVar7 = std::array<unsigned_int,_3UL>::operator[]
                     ((array<unsigned_int,_3UL> *)
                      ((long)&(nodevals->
                              super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>).
                              m_storage.m_cols + 4),0);
  if (*pvVar7 < 2) {
    local_43c = 0;
  }
  else {
    ppQVar8 = std::array<const_lf::quad::QuadRule_*,_3UL>::operator[]
                        ((array<const_lf::quad::QuadRule_*,_3UL> *)
                         &nodevals[1].super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>
                          .m_storage.m_cols,0);
    local_43c = quad::QuadRule::NumPoints(*ppQVar8);
  }
  Ns2 = local_43c;
  pvVar7 = std::array<unsigned_int,_3UL>::operator[]
                     ((array<unsigned_int,_3UL> *)
                      ((long)&(nodevals->
                              super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>).
                              m_storage.m_cols + 4),1);
  if (*pvVar7 < 2) {
    local_440 = 0;
  }
  else {
    ppQVar8 = std::array<const_lf::quad::QuadRule_*,_3UL>::operator[]
                        ((array<const_lf::quad::QuadRule_*,_3UL> *)
                         &nodevals[1].super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>
                          .m_storage.m_cols,1);
    local_440 = quad::QuadRule::NumPoints(*ppQVar8);
  }
  Nt = local_440;
  pvVar7 = std::array<unsigned_int,_3UL>::operator[]
                     ((array<unsigned_int,_3UL> *)
                      ((long)&(nodevals->
                              super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>).
                              m_storage.m_cols + 4),2);
  if (*pvVar7 < 2) {
    local_444 = 0;
  }
  else {
    ppQVar8 = std::array<const_lf::quad::QuadRule_*,_3UL>::operator[]
                        ((array<const_lf::quad::QuadRule_*,_3UL> *)
                         &nodevals[1].super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>
                          .m_storage.m_cols,2);
    local_444 = quad::QuadRule::NumPoints(*ppQVar8);
  }
  local_2c = local_444;
  local_30 = quad::QuadRule::NumPoints
                       ((QuadRule *)
                        nodevals[3].super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>.
                        m_storage.m_data);
  i._3_1_ = 0;
  pvVar7 = std::array<unsigned_int,_3UL>::operator[]
                     ((array<unsigned_int,_3UL> *)
                      ((long)&(nodevals->
                              super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>).
                              m_storage.m_cols + 4),0);
  vVar2 = *pvVar7;
  pvVar7 = std::array<unsigned_int,_3UL>::operator[]
                     ((array<unsigned_int,_3UL> *)
                      ((long)&(nodevals->
                              super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>).
                              m_storage.m_cols + 4),1);
  vVar3 = *pvVar7;
  pvVar7 = std::array<unsigned_int,_3UL>::operator[]
                     ((array<unsigned_int,_3UL> *)
                      ((long)&(nodevals->
                              super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>).
                              m_storage.m_cols + 4),2);
  local_38 = (vVar2 + vVar3 + *pvVar7) - 3;
  Eigen::Matrix<double,_1,_-1,_1,_1,_-1>::Matrix<unsigned_int>
            ((Matrix<double,_1,__1,_1,_1,__1> *)this,&local_38);
  P0._4_4_ = 2;
  while( true ) {
    uVar6 = P0._4_4_;
    pvVar7 = std::array<unsigned_int,_3UL>::operator[]
                       ((array<unsigned_int,_3UL> *)
                        ((long)&(nodevals->
                                super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>).
                                m_storage.m_cols + 4),0);
    if (*pvVar7 + 1 <= uVar6) break;
    dVar15 = ILegendreDx(P0._4_4_,0.0,1.0);
    psidd.super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>.m_storage.m_cols =
         (Index)ILegendreDx(P0._4_4_,1.0,1.0);
    ppQVar8 = std::array<const_lf::quad::QuadRule_*,_3UL>::operator[]
                        ((array<const_lf::quad::QuadRule_*,_3UL> *)
                         &nodevals[1].super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>
                          .m_storage.m_cols,0);
    pDVar9 = (DenseBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)quad::QuadRule::Points(*ppQVar8);
    integ1 = (double)((long)&P0 + 4);
    CVar16 = Eigen::DenseBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
             unaryExpr<lf::fe::FeHierarchicTria<double>::NodalValuesToEdgeDofs(Eigen::Matrix<double,1,_1,1,1,_1>const&)const::_lambda(double)_1_>
                       (pDVar9,(anon_class_8_1_54a39809_for_op *)&integ1);
    local_80 = CVar16;
    Eigen::Matrix<double,1,-1,1,1,-1>::
    Matrix<Eigen::CwiseUnaryOp<lf::fe::FeHierarchicTria<double>::NodalValuesToEdgeDofs(Eigen::Matrix<double,1,_1,1,1,_1>const&)const::_lambda(double)_1_,Eigen::Matrix<double,_1,_1,0,_1,_1>const>>
              ((Matrix<double,1,_1,1,1,_1> *)local_70,
               (EigenBase<Eigen::CwiseUnaryOp<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_lib_lf_fe_hierarchic_fe_h:962:15),_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                *)&local_80);
    ppQVar8 = std::array<const_lf::quad::QuadRule_*,_3UL>::operator[]
                        ((array<const_lf::quad::QuadRule_*,_3UL> *)
                         &nodevals[1].super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>
                          .m_storage.m_cols,0);
    pDVar10 = (DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)
              quad::QuadRule::Weights(*ppQVar8);
    local_118 = (non_const_type)
                Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::transpose(pDVar10);
    local_110.m_matrix =
         (non_const_type)
         Eigen::MatrixBase<Eigen::Transpose<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>::array
                   ((MatrixBase<Eigen::Transpose<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_> *)
                    &local_118);
    local_120 = (NestedExpressionType)
                Eigen::MatrixBase<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>_>::array
                          ((MatrixBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_> *)local_70);
    Eigen::
    ArrayBase<Eigen::ArrayWrapper<Eigen::Transpose<Eigen::Matrix<double,-1,1,0,-1,1>const>const>>::
    operator*(&local_108,
              (ArrayBase<Eigen::ArrayWrapper<Eigen::Transpose<Eigen::Matrix<double,_1,1,0,_1,1>const>const>>
               *)&local_110,
              (ArrayBase<Eigen::ArrayWrapper<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>_> *)&local_120
             );
    Eigen::DenseBase<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>_>::segment<unsigned_int>
              ((Type *)local_190,_Ns1,3,Ns2);
    Eigen::MatrixBase<Eigen::Block<const_Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_1,_-1,_false>_>::
    array(&local_158,
          (MatrixBase<Eigen::Block<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1,__1,_false>_> *)
          local_190);
    Eigen::
    ArrayBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::ArrayWrapper<Eigen::Transpose<Eigen::Matrix<double,-1,1,0,-1,1>const>const>const,Eigen::ArrayWrapper<Eigen::Matrix<double,1,-1,1,1,-1>>const>>
    ::operator*(&local_f0,
                (ArrayBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::ArrayWrapper<Eigen::Transpose<Eigen::Matrix<double,_1,1,0,_1,1>const>const>const,Eigen::ArrayWrapper<Eigen::Matrix<double,1,_1,1,1,_1>>const>>
                 *)&local_108,
                (ArrayBase<Eigen::ArrayWrapper<const_Eigen::Block<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1,__1,_false>_>_>
                 *)&local_158);
    local_90 = Eigen::
               DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::ArrayWrapper<const_Eigen::Transpose<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>,_const_Eigen::ArrayWrapper<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>_>_>,_const_Eigen::ArrayWrapper<const_Eigen::Block<const_Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_1,_-1,_false>_>_>_>
               ::sum((DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::ArrayWrapper<const_Eigen::Transpose<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>,_const_Eigen::ArrayWrapper<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>_>,_const_Eigen::ArrayWrapper<const_Eigen::Block<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1,__1,_false>_>_>_>
                      *)&local_f0);
    peVar11 = std::span<const_lf::mesh::Orientation,_18446744073709551615UL>::operator[]
                        ((span<const_lf::mesh::Orientation,_18446744073709551615UL> *)
                         &nodevals[3].super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>
                          .m_storage.m_cols,0);
    IVar5 = psidd.super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>.m_storage.m_cols;
    if (*peVar11 == positive) {
      pdVar12 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_0>::operator[]
                          ((DenseCoeffsBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0> *)_Ns1,1);
      dVar1 = *pdVar12;
      pdVar12 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_0>::operator[]
                          ((DenseCoeffsBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0> *)_Ns1,0);
      dVar15 = ((double)IVar5 * dVar1 - dVar15 * *pdVar12) - local_90;
      iVar4 = P0._4_4_ * 2;
      pSVar13 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_1>::operator[]
                          ((DenseCoeffsBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1> *)this,
                           (ulong)(P0._4_4_ - 2));
      *pSVar13 = dVar15 * (double)(iVar4 - 1);
    }
    else {
      pdVar12 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_0>::operator[]
                          ((DenseCoeffsBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0> *)_Ns1,0);
      dVar1 = *pdVar12;
      pdVar12 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_0>::operator[]
                          ((DenseCoeffsBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0> *)_Ns1,1);
      uVar6 = P0._4_4_;
      dVar15 = ((double)IVar5 * dVar1 - dVar15 * *pdVar12) - local_90;
      iVar4 = P0._4_4_ * 2;
      pvVar7 = std::array<unsigned_int,_3UL>::operator[]
                         ((array<unsigned_int,_3UL> *)
                          ((long)&(nodevals->
                                  super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>).
                                  m_storage.m_cols + 4),0);
      pSVar13 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_1>::operator[]
                          ((DenseCoeffsBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1> *)this,
                           (ulong)(*pvVar7 - uVar6));
      *pSVar13 = dVar15 * (double)(iVar4 - 1);
    }
    Eigen::Matrix<double,_1,_-1,_1,_1,_-1>::~Matrix((Matrix<double,_1,__1,_1,_1,__1> *)local_70);
    P0._4_4_ = P0._4_4_ + 1;
  }
  P0_1._4_4_ = 2;
  while( true ) {
    uVar6 = P0_1._4_4_;
    pvVar7 = std::array<unsigned_int,_3UL>::operator[]
                       ((array<unsigned_int,_3UL> *)
                        ((long)&(nodevals->
                                super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>).
                                m_storage.m_cols + 4),1);
    if (*pvVar7 + 1 <= uVar6) break;
    dVar15 = ILegendreDx(P0_1._4_4_,0.0,1.0);
    psidd_1.super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>.m_storage.m_cols =
         (Index)ILegendreDx(P0_1._4_4_,1.0,1.0);
    ppQVar8 = std::array<const_lf::quad::QuadRule_*,_3UL>::operator[]
                        ((array<const_lf::quad::QuadRule_*,_3UL> *)
                         &nodevals[1].super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>
                          .m_storage.m_cols,1);
    pDVar9 = (DenseBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)quad::QuadRule::Points(*ppQVar8);
    integ2 = (double)((long)&P0_1 + 4);
    CVar17 = Eigen::DenseBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
             unaryExpr<lf::fe::FeHierarchicTria<double>::NodalValuesToEdgeDofs(Eigen::Matrix<double,1,_1,1,1,_1>const&)const::_lambda(double)_2_>
                       (pDVar9,(anon_class_8_1_54a39809_for_op *)&integ2);
    local_1c8 = CVar17;
    Eigen::Matrix<double,1,-1,1,1,-1>::
    Matrix<Eigen::CwiseUnaryOp<lf::fe::FeHierarchicTria<double>::NodalValuesToEdgeDofs(Eigen::Matrix<double,1,_1,1,1,_1>const&)const::_lambda(double)_2_,Eigen::Matrix<double,_1,_1,0,_1,_1>const>>
              ((Matrix<double,1,_1,1,1,_1> *)local_1b8,
               (EigenBase<Eigen::CwiseUnaryOp<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_lib_lf_fe_hierarchic_fe_h:982:15),_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                *)&local_1c8);
    ppQVar8 = std::array<const_lf::quad::QuadRule_*,_3UL>::operator[]
                        ((array<const_lf::quad::QuadRule_*,_3UL> *)
                         &nodevals[1].super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>
                          .m_storage.m_cols,1);
    pDVar10 = (DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)
              quad::QuadRule::Weights(*ppQVar8);
    local_260 = (non_const_type)
                Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::transpose(pDVar10);
    local_258.m_matrix =
         (non_const_type)
         Eigen::MatrixBase<Eigen::Transpose<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>::array
                   ((MatrixBase<Eigen::Transpose<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_> *)
                    &local_260);
    local_268 = (NestedExpressionType)
                Eigen::MatrixBase<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>_>::array
                          ((MatrixBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_> *)local_1b8);
    Eigen::
    ArrayBase<Eigen::ArrayWrapper<Eigen::Transpose<Eigen::Matrix<double,-1,1,0,-1,1>const>const>>::
    operator*(&local_250,
              (ArrayBase<Eigen::ArrayWrapper<Eigen::Transpose<Eigen::Matrix<double,_1,1,0,_1,1>const>const>>
               *)&local_258,
              (ArrayBase<Eigen::ArrayWrapper<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>_> *)&local_268
             );
    Eigen::DenseBase<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>_>::segment<unsigned_int>
              ((Type *)local_2d8,_Ns1,(ulong)(Ns2 + 3),Nt);
    Eigen::MatrixBase<Eigen::Block<const_Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_1,_-1,_false>_>::
    array(&local_2a0,
          (MatrixBase<Eigen::Block<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1,__1,_false>_> *)
          local_2d8);
    Eigen::
    ArrayBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::ArrayWrapper<Eigen::Transpose<Eigen::Matrix<double,-1,1,0,-1,1>const>const>const,Eigen::ArrayWrapper<Eigen::Matrix<double,1,-1,1,1,-1>>const>>
    ::operator*(&local_238,
                (ArrayBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::ArrayWrapper<Eigen::Transpose<Eigen::Matrix<double,_1,1,0,_1,1>const>const>const,Eigen::ArrayWrapper<Eigen::Matrix<double,1,_1,1,1,_1>>const>>
                 *)&local_250,
                (ArrayBase<Eigen::ArrayWrapper<const_Eigen::Block<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1,__1,_false>_>_>
                 *)&local_2a0);
    local_1d8 = Eigen::
                DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::ArrayWrapper<const_Eigen::Transpose<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>,_const_Eigen::ArrayWrapper<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>_>_>,_const_Eigen::ArrayWrapper<const_Eigen::Block<const_Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_1,_-1,_false>_>_>_>
                ::sum((DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::ArrayWrapper<const_Eigen::Transpose<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>,_const_Eigen::ArrayWrapper<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>_>,_const_Eigen::ArrayWrapper<const_Eigen::Block<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1,__1,_false>_>_>_>
                       *)&local_238);
    peVar11 = std::span<const_lf::mesh::Orientation,_18446744073709551615UL>::operator[]
                        ((span<const_lf::mesh::Orientation,_18446744073709551615UL> *)
                         &nodevals[3].super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>
                          .m_storage.m_cols,1);
    IVar5 = psidd_1.super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>.m_storage.m_cols;
    if (*peVar11 == positive) {
      pdVar12 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_0>::operator[]
                          ((DenseCoeffsBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0> *)_Ns1,2);
      dVar1 = *pdVar12;
      pdVar12 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_0>::operator[]
                          ((DenseCoeffsBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0> *)_Ns1,1);
      uVar6 = P0_1._4_4_;
      dVar15 = ((double)IVar5 * dVar1 - dVar15 * *pdVar12) - local_1d8;
      iVar4 = P0_1._4_4_ * 2;
      pvVar7 = std::array<unsigned_int,_3UL>::operator[]
                         ((array<unsigned_int,_3UL> *)
                          ((long)&(nodevals->
                                  super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>).
                                  m_storage.m_cols + 4),0);
      pSVar13 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_1>::operator[]
                          ((DenseCoeffsBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1> *)this,
                           (ulong)((*pvVar7 - 3) + uVar6));
      *pSVar13 = dVar15 * (double)(iVar4 - 1);
    }
    else {
      pdVar12 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_0>::operator[]
                          ((DenseCoeffsBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0> *)_Ns1,1);
      dVar1 = *pdVar12;
      pdVar12 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_0>::operator[]
                          ((DenseCoeffsBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0> *)_Ns1,2);
      uVar6 = P0_1._4_4_;
      dVar15 = ((double)IVar5 * dVar1 - dVar15 * *pdVar12) - local_1d8;
      iVar4 = P0_1._4_4_ * 2;
      paVar14 = (array<unsigned_int,_3UL> *)
                ((long)&(nodevals->super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>).
                        m_storage.m_cols + 4);
      pvVar7 = std::array<unsigned_int,_3UL>::operator[](paVar14,0);
      vVar2 = *pvVar7;
      pvVar7 = std::array<unsigned_int,_3UL>::operator[](paVar14,1);
      pSVar13 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_1>::operator[]
                          ((DenseCoeffsBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1> *)this,
                           (ulong)(~uVar6 + vVar2 + *pvVar7));
      *pSVar13 = dVar15 * (double)(iVar4 - 1);
    }
    Eigen::Matrix<double,_1,_-1,_1,_1,_-1>::~Matrix((Matrix<double,_1,__1,_1,_1,__1> *)local_1b8);
    P0_1._4_4_ = P0_1._4_4_ + 1;
  }
  P0_2._4_4_ = 2;
  while( true ) {
    uVar6 = P0_2._4_4_;
    pvVar7 = std::array<unsigned_int,_3UL>::operator[]
                       ((array<unsigned_int,_3UL> *)
                        ((long)&(nodevals->
                                super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>).
                                m_storage.m_cols + 4),2);
    if (*pvVar7 + 1 <= uVar6) break;
    dVar15 = ILegendreDx(P0_2._4_4_,0.0,1.0);
    psidd_2.super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>.m_storage.m_cols =
         (Index)ILegendreDx(P0_2._4_4_,1.0,1.0);
    ppQVar8 = std::array<const_lf::quad::QuadRule_*,_3UL>::operator[]
                        ((array<const_lf::quad::QuadRule_*,_3UL> *)
                         &nodevals[1].super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>
                          .m_storage.m_cols,2);
    pDVar9 = (DenseBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)quad::QuadRule::Points(*ppQVar8);
    integ3 = (double)((long)&P0_2 + 4);
    CVar18 = Eigen::DenseBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
             unaryExpr<lf::fe::FeHierarchicTria<double>::NodalValuesToEdgeDofs(Eigen::Matrix<double,1,_1,1,1,_1>const&)const::_lambda(double)_3_>
                       (pDVar9,(anon_class_8_1_54a39809_for_op *)&integ3);
    local_310 = CVar18;
    Eigen::Matrix<double,1,-1,1,1,-1>::
    Matrix<Eigen::CwiseUnaryOp<lf::fe::FeHierarchicTria<double>::NodalValuesToEdgeDofs(Eigen::Matrix<double,1,_1,1,1,_1>const&)const::_lambda(double)_3_,Eigen::Matrix<double,_1,_1,0,_1,_1>const>>
              ((Matrix<double,1,_1,1,1,_1> *)local_300,
               (EigenBase<Eigen::CwiseUnaryOp<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_lib_lf_fe_hierarchic_fe_h:1003:15),_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                *)&local_310);
    ppQVar8 = std::array<const_lf::quad::QuadRule_*,_3UL>::operator[]
                        ((array<const_lf::quad::QuadRule_*,_3UL> *)
                         &nodevals[1].super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>
                          .m_storage.m_cols,2);
    pDVar10 = (DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)
              quad::QuadRule::Weights(*ppQVar8);
    local_3a8 = (non_const_type)
                Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::transpose(pDVar10);
    local_3a0.m_matrix =
         (non_const_type)
         Eigen::MatrixBase<Eigen::Transpose<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>::array
                   ((MatrixBase<Eigen::Transpose<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_> *)
                    &local_3a8);
    local_3b0 = (NestedExpressionType)
                Eigen::MatrixBase<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>_>::array
                          ((MatrixBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_> *)local_300);
    Eigen::
    ArrayBase<Eigen::ArrayWrapper<Eigen::Transpose<Eigen::Matrix<double,-1,1,0,-1,1>const>const>>::
    operator*(&local_398,
              (ArrayBase<Eigen::ArrayWrapper<Eigen::Transpose<Eigen::Matrix<double,_1,1,0,_1,1>const>const>>
               *)&local_3a0,
              (ArrayBase<Eigen::ArrayWrapper<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>_> *)&local_3b0
             );
    Eigen::DenseBase<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>_>::segment<unsigned_int>
              (&local_420,_Ns1,(ulong)(Ns2 + 3 + Nt),local_2c);
    Eigen::MatrixBase<Eigen::Block<const_Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_1,_-1,_false>_>::
    array(&local_3e8,
          (MatrixBase<Eigen::Block<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1,__1,_false>_> *)
          &local_420);
    Eigen::
    ArrayBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::ArrayWrapper<Eigen::Transpose<Eigen::Matrix<double,-1,1,0,-1,1>const>const>const,Eigen::ArrayWrapper<Eigen::Matrix<double,1,-1,1,1,-1>>const>>
    ::operator*(&local_380,
                (ArrayBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::ArrayWrapper<Eigen::Transpose<Eigen::Matrix<double,_1,1,0,_1,1>const>const>const,Eigen::ArrayWrapper<Eigen::Matrix<double,1,_1,1,1,_1>>const>>
                 *)&local_398,
                (ArrayBase<Eigen::ArrayWrapper<const_Eigen::Block<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1,__1,_false>_>_>
                 *)&local_3e8);
    local_320 = Eigen::
                DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::ArrayWrapper<const_Eigen::Transpose<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>,_const_Eigen::ArrayWrapper<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>_>_>,_const_Eigen::ArrayWrapper<const_Eigen::Block<const_Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_1,_-1,_false>_>_>_>
                ::sum((DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::ArrayWrapper<const_Eigen::Transpose<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>,_const_Eigen::ArrayWrapper<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>_>,_const_Eigen::ArrayWrapper<const_Eigen::Block<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1,__1,_false>_>_>_>
                       *)&local_380);
    peVar11 = std::span<const_lf::mesh::Orientation,_18446744073709551615UL>::operator[]
                        ((span<const_lf::mesh::Orientation,_18446744073709551615UL> *)
                         &nodevals[3].super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>
                          .m_storage.m_cols,2);
    IVar5 = psidd_2.super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>.m_storage.m_cols;
    if (*peVar11 == positive) {
      pdVar12 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_0>::operator[]
                          ((DenseCoeffsBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0> *)_Ns1,0);
      dVar1 = *pdVar12;
      pdVar12 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_0>::operator[]
                          ((DenseCoeffsBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0> *)_Ns1,2);
      uVar6 = P0_2._4_4_;
      dVar15 = ((double)IVar5 * dVar1 - dVar15 * *pdVar12) - local_320;
      iVar4 = P0_2._4_4_ * 2;
      paVar14 = (array<unsigned_int,_3UL> *)
                ((long)&(nodevals->super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>).
                        m_storage.m_cols + 4);
      pvVar7 = std::array<unsigned_int,_3UL>::operator[](paVar14,0);
      vVar2 = *pvVar7;
      pvVar7 = std::array<unsigned_int,_3UL>::operator[](paVar14,1);
      pSVar13 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_1>::operator[]
                          ((DenseCoeffsBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1> *)this,
                           (ulong)((uVar6 - 4) + vVar2 + *pvVar7));
      *pSVar13 = dVar15 * (double)(iVar4 - 1);
    }
    else {
      pdVar12 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_0>::operator[]
                          ((DenseCoeffsBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0> *)_Ns1,2);
      dVar1 = *pdVar12;
      pdVar12 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_0>::operator[]
                          ((DenseCoeffsBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0> *)_Ns1,0);
      uVar6 = P0_2._4_4_;
      dVar15 = ((double)IVar5 * dVar1 - dVar15 * *pdVar12) - local_320;
      iVar4 = P0_2._4_4_ * 2;
      paVar14 = (array<unsigned_int,_3UL> *)
                ((long)&(nodevals->super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>).
                        m_storage.m_cols + 4);
      pvVar7 = std::array<unsigned_int,_3UL>::operator[](paVar14,0);
      vVar2 = *pvVar7;
      pvVar7 = std::array<unsigned_int,_3UL>::operator[](paVar14,1);
      vVar3 = *pvVar7;
      pvVar7 = std::array<unsigned_int,_3UL>::operator[](paVar14,2);
      pSVar13 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_1>::operator[]
                          ((DenseCoeffsBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1> *)this,
                           (ulong)(((vVar2 + vVar3 + *pvVar7) - uVar6) - 2));
      *pSVar13 = dVar15 * (double)(iVar4 - 1);
    }
    Eigen::Matrix<double,_1,_-1,_1,_1,_-1>::~Matrix((Matrix<double,_1,__1,_1,_1,__1> *)local_300);
    P0_2._4_4_ = P0_2._4_4_ + 1;
  }
  MVar19.super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>.m_storage.m_cols =
       extraout_RDX;
  MVar19.super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>.m_storage.m_data =
       (double *)this;
  return (Matrix<double,_1,__1,_1,_1,__1>)
         MVar19.super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>.m_storage;
}

Assistant:

[[nodiscard]] Eigen::Matrix<SCALAR, 1, Eigen::Dynamic> NodalValuesToEdgeDofs(
      const Eigen::Matrix<SCALAR, 1, Eigen::Dynamic> &nodevals) const {
    const auto Ns0 = edge_degrees_[0] > 1 ? qr_dual_edge_[0]->NumPoints() : 0;
    const auto Ns1 = edge_degrees_[1] > 1 ? qr_dual_edge_[1]->NumPoints() : 0;
    const auto Ns2 = edge_degrees_[2] > 1 ? qr_dual_edge_[2]->NumPoints() : 0;
    const lf::base::size_type Nt = qr_dual_tria_->NumPoints();
    Eigen::Matrix<SCALAR, 1, Eigen::Dynamic> dofs(
        edge_degrees_[0] + edge_degrees_[1] + edge_degrees_[2] - 3);
    // Compute the basis function coefficients on the edges
    // by applying the dual basis of the segment

    // first edge:
    for (base::size_type i = 2; i < edge_degrees_[0] + 1; ++i) {
      const SCALAR P0 = ILegendreDx(i, 0);
      const SCALAR P1 = ILegendreDx(i, 1);
      Eigen::Matrix<SCALAR, 1, Eigen::Dynamic> psidd =
          qr_dual_edge_[0]->Points().unaryExpr(
              [&](double x) -> SCALAR { return LegendreDx(i - 1, x); });

      const SCALAR integ1 = (qr_dual_edge_[0]->Weights().transpose().array() *
                             psidd.array() * nodevals.segment(3, Ns0).array())
                                .sum();
      if (rel_orient_[0] == lf::mesh::Orientation::positive) {
        dofs[1 + i - 3] =
            (P1 * nodevals[1] - P0 * nodevals[0] - integ1) * (2 * i - 1);
      } else {
        dofs[4 - i + (edge_degrees_[0] - 1) - 3] =
            (P1 * nodevals[0] - P0 * nodevals[1] - integ1) * (2 * i - 1);
      }
    }

    // Compute the basis function coefficients for the second edge
    for (base::size_type i = 2; i < edge_degrees_[1] + 1; ++i) {
      const SCALAR P0 = ILegendreDx(i, 0);
      const SCALAR P1 = ILegendreDx(i, 1);
      Eigen::Matrix<SCALAR, 1, Eigen::Dynamic> psidd =
          qr_dual_edge_[1]->Points().unaryExpr(
              [&](double x) -> SCALAR { return LegendreDx(i - 1, x); });

      const SCALAR integ2 =
          (qr_dual_edge_[1]->Weights().transpose().array() * psidd.array() *
           nodevals.segment(3 + Ns0, Ns1).array())
              .sum();
      if (rel_orient_[1] == lf::mesh::Orientation::positive) {
        dofs[1 + i + (edge_degrees_[0] - 1) - 3] =
            (P1 * nodevals[2] - P0 * nodevals[1] - integ2) * (2 * i - 1);
      } else {
        dofs[4 - i + (edge_degrees_[0] + edge_degrees_[1] - 2) - 3] =
            (P1 * nodevals[1] - P0 * nodevals[2] - integ2) * (2 * i - 1);
      }
    }

    // Compute the basis function coefficients for the second edge
    for (base::size_type i = 2; i < edge_degrees_[2] + 1; ++i) {
      const SCALAR P0 = ILegendreDx(i, 0);
      const SCALAR P1 = ILegendreDx(i, 1);
      Eigen::Matrix<SCALAR, 1, Eigen::Dynamic> psidd =
          qr_dual_edge_[2]->Points().unaryExpr(
              [&](double x) -> SCALAR { return LegendreDx(i - 1, x); });

      const SCALAR integ3 =
          (qr_dual_edge_[2]->Weights().transpose().array() * psidd.array() *
           nodevals.segment(3 + Ns0 + Ns1, Ns2).array())
              .sum();
      if (rel_orient_[2] == lf::mesh::Orientation::positive) {
        dofs[1 + i + (edge_degrees_[0] + edge_degrees_[1] - 2) - 3] =
            (P1 * nodevals[0] - P0 * nodevals[2] - integ3) * (2 * i - 1);
      } else {
        dofs[4 - i +
             (edge_degrees_[0] + edge_degrees_[1] + edge_degrees_[2] - 3) - 3] =
            (P1 * nodevals[2] - P0 * nodevals[0] - integ3) * (2 * i - 1);
      }
    }

    return dofs;
  }